

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushItemWidth(float item_width)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float local_24;
  ImGuiWindow *window;
  ImGuiContext *g;
  float item_width_local;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  local_24 = item_width;
  if ((item_width == 0.0) && (!NAN(item_width))) {
    local_24 = pIVar1->ItemWidthDefault;
  }
  (pIVar1->DC).ItemWidth = local_24;
  ImVector<float>::push_back(&(pIVar1->DC).ItemWidthStack,&(pIVar1->DC).ItemWidth);
  (pIVar2->NextItemData).Flags = (pIVar2->NextItemData).Flags & 0xfffffffe;
  return;
}

Assistant:

void ImGui::PushItemWidth(float item_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.ItemWidth = (item_width == 0.0f ? window->ItemWidthDefault : item_width);
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth);
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}